

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  xmlChar *pxVar9;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  int max;
  int local_3c;
  xmlURIPtr local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  local_3c = 0x50;
  pxVar4 = (xmlChar *)(*xmlMallocAtomic)(0x51);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlURIErrMemory("saving URI\n");
    return (xmlChar *)0x0;
  }
  pcVar1 = uri->scheme;
  local_38 = uri;
  if (pcVar1 == (char *)0x0) {
    iVar13 = 0;
  }
  else {
    if (*pcVar1 == '\0') {
      uVar17 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pxVar6 = pxVar4;
        if (((long)local_3c <= (long)uVar12) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0018c37e;
        uVar17 = uVar12 + 1;
        pxVar6[uVar12] = pcVar1[uVar12];
        lVar8 = uVar12 + 1;
        uVar12 = uVar17;
        pxVar4 = pxVar6;
      } while (pcVar1[lVar8] != '\0');
    }
    pxVar6 = pxVar4;
    if ((local_3c <= (int)uVar17) &&
       (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0)) goto LAB_0018c37e;
    iVar13 = (int)uVar17 + 1;
    pxVar6[uVar17 & 0xffffffff] = ':';
    pxVar4 = pxVar6;
  }
  pbVar11 = (byte *)local_38->opaque;
  pxVar6 = pxVar4;
  if (pbVar11 == (byte *)0x0) {
    if ((local_38->server == (char *)0x0) && (local_38->port != -1)) {
      if (local_38->authority == (char *)0x0) {
        if (((local_38->scheme != (char *)0x0) && (local_3c <= iVar13 + 3)) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0018c37e;
      }
      else {
        if ((local_3c <= iVar13 + 3) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0018c37e;
        (pxVar6 + iVar13)[0] = '/';
        (pxVar6 + iVar13)[1] = '/';
        iVar13 = iVar13 + 2;
        if (*local_38->authority != 0) {
          pxVar4 = pxVar6;
          pbVar11 = (byte *)local_38->authority;
          iVar10 = iVar13;
          do {
            pbVar16 = pbVar11 + 1;
            iVar13 = iVar10 + 3;
            pxVar6 = pxVar4;
            if ((local_3c <= iVar13) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0018c37e;
            bVar3 = *pbVar11;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x4000000096003fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              iVar13 = iVar10 + 1;
              iVar14 = iVar10;
            }
            else {
              pxVar6[iVar10] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              iVar14 = iVar10 + 2;
              pxVar6[(long)iVar10 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar6[iVar14] = bVar3;
            pxVar4 = pxVar6;
            pbVar11 = pbVar16;
            iVar10 = iVar13;
          } while (*pbVar16 != 0);
        }
      }
    }
    else {
      if ((local_3c <= iVar13 + 3) &&
         (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
      goto LAB_0018c37e;
      pxVar4 = pxVar6;
      (pxVar4 + iVar13)[0] = '/';
      (pxVar4 + iVar13)[1] = '/';
      uVar15 = iVar13 + 2;
      uVar17 = (ulong)uVar15;
      pbVar11 = (byte *)local_38->user;
      if (pbVar11 != (byte *)0x0) {
        if (*pbVar11 != 0) {
          do {
            pbVar16 = pbVar11 + 1;
            iVar13 = (int)uVar17;
            uVar15 = iVar13 + 3;
            pxVar6 = pxVar4;
            if ((local_3c <= (int)uVar15) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0018c37e;
            pxVar4 = pxVar6;
            bVar3 = *pbVar11;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x4000000016003fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              uVar15 = iVar13 + 1;
              iVar10 = iVar13;
            }
            else {
              pxVar4[iVar13] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              iVar10 = iVar13 + 2;
              pxVar4[(long)iVar13 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar4[iVar10] = bVar3;
            uVar17 = (ulong)uVar15;
            pbVar11 = pbVar16;
          } while (*pbVar16 != 0);
        }
        pxVar6 = pxVar4;
        if ((local_3c <= (int)(uVar15 + 3)) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0018c37e;
        pxVar6[(int)uVar15] = '@';
        uVar17 = (ulong)(uVar15 + 1);
        pxVar4 = pxVar6;
      }
      iVar13 = (int)uVar17;
      pxVar5 = (xmlChar *)local_38->server;
      pxVar6 = pxVar4;
      if (pxVar5 != (xmlChar *)0x0) {
        if (*pxVar5 != '\0') {
          uVar17 = (ulong)iVar13;
          do {
            pxVar9 = pxVar5 + 1;
            pxVar6 = pxVar4;
            if (((long)local_3c <= (long)uVar17) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0018c37e;
            pxVar6[uVar17] = *pxVar5;
            uVar17 = uVar17 + 1;
            pxVar4 = pxVar6;
            pxVar5 = pxVar9;
          } while (*pxVar9 != '\0');
        }
        iVar13 = (int)uVar17;
        pxVar6 = pxVar4;
        if (0 < local_38->port) {
          if ((local_3c <= iVar13 + 10) &&
             (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
          goto LAB_0018c37e;
          iVar10 = snprintf((char *)(pxVar6 + iVar13),(long)local_3c - (long)iVar13,":%d",
                            (ulong)(uint)local_38->port);
          iVar13 = iVar10 + iVar13;
        }
      }
    }
    pbVar11 = (byte *)local_38->path;
    if (pbVar11 != (byte *)0x0) {
      if ((((xmlChar *)local_38->scheme != (xmlChar *)0x0) && (*pbVar11 == 0x2f)) &&
         (((byte)((pbVar11[1] & 0xdf) + 0xbf) < 0x1a &&
          ((pbVar11[2] == 0x3a &&
           (iVar10 = xmlStrEqual((xmlChar *)local_38->scheme,"file"), iVar10 != 0)))))) {
        pxVar5 = pxVar6;
        if ((local_3c <= iVar13 + 3) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0018c37e;
        pxVar5[iVar13] = *pbVar11;
        pxVar5[(long)iVar13 + 1] = pbVar11[1];
        pbVar16 = pbVar11 + 2;
        pbVar11 = pbVar11 + 3;
        pxVar5[(long)iVar13 + 2] = *pbVar16;
        pxVar6 = pxVar5;
        iVar13 = iVar13 + 3;
      }
      bVar3 = *pbVar11;
      while (bVar3 != 0) {
        iVar10 = iVar13 + 3;
        pxVar5 = pxVar6;
        if ((local_3c <= iVar10) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0018c37e;
        bVar3 = *pbVar11;
        if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
           (((bVar3 - 0x21 < 0x3f &&
             ((0x4000000094007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) || (bVar3 == 0x7e))
           )) {
          iVar10 = iVar13 + 1;
          iVar14 = iVar13;
        }
        else {
          pxVar5[iVar13] = '%';
          cVar2 = '0';
          if (0x9f < bVar3) {
            cVar2 = '7';
          }
          iVar14 = iVar13 + 2;
          pxVar5[(long)iVar13 + 1] = cVar2 + (bVar3 >> 4);
          cVar2 = '0';
          if (9 < (bVar3 & 0xf)) {
            cVar2 = '7';
          }
          bVar3 = cVar2 + (bVar3 & 0xf);
        }
        pxVar5[iVar14] = bVar3;
        bVar3 = pbVar11[1];
        pbVar11 = pbVar11 + 1;
        pxVar6 = pxVar5;
        iVar13 = iVar10;
      }
    }
    pxVar4 = pxVar6;
    if (local_38->query_raw == (char *)0x0) {
      if (local_38->query != (char *)0x0) {
        if ((local_3c <= iVar13 + 3) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0018c37e;
        lVar8 = (long)iVar13;
        iVar13 = iVar13 + 1;
        pxVar6[lVar8] = '?';
        if (*local_38->query != 0) {
          iVar10 = iVar13;
          pbVar11 = (byte *)local_38->query;
          do {
            pbVar16 = pbVar11 + 1;
            iVar13 = iVar10 + 3;
            if ((local_3c <= iVar13) &&
               (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar6 = pxVar5,
               pxVar5 == (xmlChar *)0x0)) goto LAB_0018c37e;
            bVar3 = *pbVar11;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x54000000d6007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              iVar13 = iVar10 + 1;
              iVar14 = iVar10;
            }
            else {
              pxVar6[iVar10] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              iVar14 = iVar10 + 2;
              pxVar6[(long)iVar10 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar6[iVar14] = bVar3;
            iVar10 = iVar13;
            pbVar11 = pbVar16;
          } while (*pbVar16 != 0);
        }
      }
    }
    else {
      iVar10 = iVar13 + 1;
      if ((local_3c <= iVar10) &&
         (pxVar6 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar6 == (xmlChar *)0x0))
      goto LAB_0018c37e;
      pxVar6[iVar13] = '?';
      iVar13 = iVar10;
      if (*local_38->query_raw != '\0') {
        lVar8 = (long)iVar10;
        pxVar5 = (xmlChar *)local_38->query_raw;
        do {
          pxVar9 = pxVar5 + 1;
          if (((long)local_3c <= lVar8 + 1) &&
             (pxVar7 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar6 = pxVar7,
             pxVar7 == (xmlChar *)0x0)) goto LAB_0018c37e;
          pxVar6[lVar8] = *pxVar5;
          iVar13 = iVar13 + 1;
          lVar8 = lVar8 + 1;
          pxVar5 = pxVar9;
        } while (*pxVar9 != '\0');
      }
    }
  }
  else {
    bVar3 = *pbVar11;
    while (bVar3 != 0) {
      iVar10 = iVar13 + 3;
      if ((local_3c <= iVar10) &&
         (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar6 = pxVar5,
         pxVar5 == (xmlChar *)0x0)) goto LAB_0018c37e;
      bVar3 = *pbVar11;
      if (((((bVar3 - 0x24 < 0x3a) &&
            ((0x28000001ac00985U >> ((ulong)(bVar3 - 0x24) & 0x3f) & 1) != 0)) ||
           (((byte)(bVar3 - 0x30) < 10 || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)))) ||
          ((bVar3 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)))) || (bVar3 == 0x7e))
      {
        iVar10 = iVar13 + 1;
        iVar14 = iVar13;
      }
      else {
        pxVar6[iVar13] = '%';
        cVar2 = '0';
        if (0x9f < bVar3) {
          cVar2 = '7';
        }
        iVar14 = iVar13 + 2;
        pxVar6[(long)iVar13 + 1] = cVar2 + (bVar3 >> 4);
        cVar2 = '0';
        if (9 < (bVar3 & 0xf)) {
          cVar2 = '7';
        }
        bVar3 = cVar2 + (bVar3 & 0xf);
      }
      pxVar6[iVar14] = bVar3;
      bVar3 = pbVar11[1];
      pbVar11 = pbVar11 + 1;
      iVar13 = iVar10;
    }
  }
  pxVar5 = pxVar6;
  if (local_38->fragment != (char *)0x0) {
    if ((local_3c <= iVar13 + 3) &&
       (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0))
    goto LAB_0018c37e;
    lVar8 = (long)iVar13;
    iVar13 = iVar13 + 1;
    pxVar5[lVar8] = '#';
    if (*local_38->fragment != 0) {
      pbVar11 = (byte *)local_38->fragment;
      do {
        pbVar16 = pbVar11 + 1;
        if ((local_3c <= iVar13 + 3) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar5,&local_3c), pxVar4 = pxVar5, pxVar5 = pxVar6,
           pxVar6 == (xmlChar *)0x0)) goto LAB_0018c37e;
        bVar3 = *pbVar11;
        if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
           (((bVar3 - 0x21 < 0x3f &&
             ((0x54000000d6007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) || (bVar3 == 0x7e))
           )) {
          iVar10 = iVar13;
          iVar13 = iVar13 + 1;
        }
        else {
          pxVar5[iVar13] = '%';
          cVar2 = '0';
          if (0x9f < bVar3) {
            cVar2 = '7';
          }
          iVar10 = iVar13 + 2;
          pxVar5[(long)iVar13 + 1] = cVar2 + (bVar3 >> 4);
          cVar2 = '0';
          if (9 < (bVar3 & 0xf)) {
            cVar2 = '7';
          }
          bVar3 = cVar2 + (bVar3 & 0xf);
          iVar13 = iVar13 + 3;
        }
        pxVar5[iVar10] = bVar3;
        pbVar11 = pbVar16;
      } while (*pbVar16 != 0);
    }
  }
  pxVar6 = pxVar5;
  if ((iVar13 < local_3c) ||
     (pxVar6 = xmlSaveUriRealloc(pxVar5,&local_3c), pxVar4 = pxVar5, pxVar6 != (xmlChar *)0x0)) {
    pxVar6[iVar13] = '\0';
    return pxVar6;
  }
LAB_0018c37e:
  (*xmlFree)(pxVar4);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = (xmlChar *) xmlMallocAtomic(max + 1);
    if (ret == NULL) {
        xmlURIErrMemory("saving URI\n");
	return(NULL);
    }
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port == -1)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    ret[len++] = *p++;
		}
		if (uri->port > 0) {
		    if (len + 10 >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
		}
	    }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}